

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,ByteData *hash)

{
  size_t sVar1;
  string *message;
  ByteData *in_stack_fffffffffffffde8;
  ByteData *hash_data;
  ByteData *in_stack_fffffffffffffdf0;
  allocator *paVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe00;
  CfdException *in_stack_fffffffffffffe10;
  allocator local_181;
  string local_180;
  SchnorrPubkey local_160;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  string local_120;
  CfdSourceLocation local_100;
  allocator local_e1;
  string local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  ByteData256 local_a8;
  allocator local_89;
  string local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ByteData160 local_50;
  allocator local_21;
  ByteData *local_20;
  ByteData *hash_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  this->type_ = type;
  this->addr_type_ = kP2wshAddress;
  this->witness_ver_ = witness_ver;
  local_20 = hash;
  hash_local._0_4_ = witness_ver;
  hash_local._4_4_ = type;
  _witness_ver_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_21);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  ByteData::ByteData(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  memset(this->checksum_,0,4);
  if (this->witness_ver_ == kVersion0) {
    sVar1 = ByteData::GetDataSize(local_20);
    if (sVar1 == 0x14) {
      SetAddressType(this,kP2wpkhAddress);
      ByteData::GetBytes(&local_68,local_20);
      ByteData160::ByteData160(&local_50,&local_68);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_88,"",&local_89);
      CalculateP2WPKH(this,&local_50,&local_88);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
      ByteData160::~ByteData160((ByteData160 *)0x45cfd5);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                (in_stack_fffffffffffffe00);
    }
    else {
      sVar1 = ByteData::GetDataSize(local_20);
      if (sVar1 != 0x20) {
        local_100.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
                     ,0x2f);
        local_100.filename = local_100.filename + 1;
        local_100.line = 0x2eb;
        local_100.funcname = "Address";
        ByteData::GetHex_abi_cxx11_(&local_120,local_20);
        logger::info<std::__cxx11::string>
                  (&local_100,"illegal hash data. hash={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
        ::std::__cxx11::string::~string((string *)&local_120);
        local_142 = 1;
        message = (string *)__cxa_allocate_exception(0x30);
        paVar2 = &local_141;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_140,"hash value error.",paVar2);
        CfdException::CfdException
                  (in_stack_fffffffffffffe10,(CfdError)((ulong)paVar2 >> 0x20),message);
        local_142 = 0;
        __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
      }
      SetAddressType(this,kP2wshAddress);
      ByteData::GetBytes(&local_c0,local_20);
      ByteData256::ByteData256(&local_a8,&local_c0);
      paVar2 = &local_e1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_e0,"",paVar2);
      CalculateP2WSH(this,&local_a8,&local_e0);
      ::std::__cxx11::string::~string((string *)&local_e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      ByteData256::~ByteData256((ByteData256 *)0x45d194);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                (in_stack_fffffffffffffe00);
    }
  }
  else if (this->witness_ver_ != kVersionNone) {
    if ((this->witness_ver_ == kVersion1) &&
       (sVar1 = ByteData::GetDataSize(local_20), sVar1 == 0x20)) {
      SetAddressType(this,kTaprootAddress);
      SchnorrPubkey::SchnorrPubkey(&local_160,local_20);
      SchnorrPubkey::operator=(&this->schnorr_pubkey_,&local_160);
      SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x45d3ed);
    }
    else {
      SetAddressType(this,kWitnessUnknown);
    }
    paVar2 = &local_181;
    hash_data = local_20;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_180,"",paVar2);
    CalculateBech32m(this,hash_data,&local_180);
    ::std::__cxx11::string::~string((string *)&local_180);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const ByteData& hash)
    : type_(type),
      addr_type_(AddressType::kP2wshAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(hash),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));

  if (witness_ver_ == WitnessVersion::kVersion0) {
    if (hash.GetDataSize() == kByteData160Length) {
      SetAddressType(kP2wpkhAddress);
      CalculateP2WPKH(ByteData160(hash.GetBytes()));
    } else if (hash.GetDataSize() == kByteData256Length) {
      SetAddressType(kP2wshAddress);
      CalculateP2WSH(ByteData256(hash.GetBytes()));
    } else {
      // format error
      info(CFD_LOG_SOURCE, "illegal hash data. hash={}", hash.GetHex());
      throw CfdException(kCfdIllegalArgumentError, "hash value error.");
    }
  } else if (witness_ver_ != WitnessVersion::kVersionNone) {
    if ((witness_ver_ == WitnessVersion::kVersion1) &&
        (hash.GetDataSize() == SchnorrPubkey::kSchnorrPubkeySize)) {
      SetAddressType(kTaprootAddress);
      schnorr_pubkey_ = SchnorrPubkey(hash);
    } else {
      SetAddressType(kWitnessUnknown);
    }
    CalculateBech32m(hash);
  }
}